

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void sensors_analytics::utils::ObjectNode::ValueNode::DumpString(string *value,string *buffer)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uStack_20;
  char c;
  size_type i;
  string *buffer_local;
  string *value_local;
  
  std::__cxx11::string::operator+=((string *)buffer,'\"');
  uStack_20 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= uStack_20) break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)value);
    cVar1 = *pcVar3;
    if (cVar1 == '\b') {
      std::__cxx11::string::operator+=((string *)buffer,"\\b");
    }
    else if (cVar1 == '\t') {
      std::__cxx11::string::operator+=((string *)buffer,"\\t");
    }
    else if (cVar1 == '\n') {
      std::__cxx11::string::operator+=((string *)buffer,"\\n");
    }
    else if (cVar1 == '\f') {
      std::__cxx11::string::operator+=((string *)buffer,"\\f");
    }
    else if (cVar1 == '\r') {
      std::__cxx11::string::operator+=((string *)buffer,"\\r");
    }
    else if (cVar1 == '\"') {
      std::__cxx11::string::operator+=((string *)buffer,"\\\"");
    }
    else if (cVar1 == '\\') {
      std::__cxx11::string::operator+=((string *)buffer,"\\\\");
    }
    else {
      std::__cxx11::string::operator+=((string *)buffer,cVar1);
    }
    uStack_20 = uStack_20 + 1;
  }
  std::__cxx11::string::operator+=((string *)buffer,'\"');
  return;
}

Assistant:

void ObjectNode::ValueNode::DumpString(const string &value, string *buffer) {
  *buffer += '"';
  for (std::string::size_type i = 0; i < value.length(); ++i) {
    char c = value[i];
    switch (c) {
      case '"':
        *buffer += "\\\"";
        break;
      case '\\':
        *buffer += "\\\\";
        break;
      case '\b':
        *buffer += "\\b";
        break;
      case '\f':
        *buffer += "\\f";
        break;
      case '\n':
        *buffer += "\\n";
        break;
      case '\r':
        *buffer += "\\r";
        break;
      case '\t':
        *buffer += "\\t";
        break;
      default:
        *buffer += c;
        break;
    }
  }
  *buffer += '"';
}